

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

void fwrite32be(FILE *fp,uint32_t w)

{
  undefined4 in_ESI;
  uint8_t be [4];
  void *in_stack_ffffffffffffffe8;
  
  fwritex((FILE *)CONCAT44(in_ESI,CONCAT13((char)in_ESI,
                                           CONCAT12((char)((uint)in_ESI >> 8),
                                                    CONCAT11((char)((uint)in_ESI >> 0x10),
                                                             (char)((uint)in_ESI >> 0x18))))),
          in_stack_ffffffffffffffe8,0x10cd5e);
  return;
}

Assistant:

void fwrite32be(FILE *fp,uint32_t w)
/* write a big endian 32 bit word */
{
  uint8_t be[4];

  be[0] = (w>>24) & 0xff;
  be[1] = (w>>16) & 0xff;
  be[2] = (w>>8) & 0xff;
  be[3] = w & 0xff;
  fwritex(fp,be,4);
}